

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.cxx
# Opt level: O1

bool __thiscall
cmMathCommand::HandleExprCommand
          (cmMathCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  bool bVar5;
  cmExprParserHelper helper;
  char buffer [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  cmExprParserHelper local_4a8;
  string local_428 [32];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    cmExprParserHelper::cmExprParserHelper(&local_4a8);
    iVar2 = cmExprParserHelper::ParseString(&local_4a8,pbVar1[2]._M_dataplus._M_p,0);
    bVar5 = iVar2 != 0;
    if (iVar2 == 0) {
      std::operator+(&local_4c8,"cannot parse the expression: \"",pbVar1 + 2);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_4c8);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_428[0].field_2._0_8_ = *psVar4;
        local_428[0].field_2._8_8_ = plVar3[3];
        local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
      }
      else {
        local_428[0].field_2._0_8_ = *psVar4;
        local_428[0]._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_428[0]._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)local_428);
      cmCommand::SetError(&this->super_cmCommand,local_428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428[0]._M_dataplus._M_p != &local_428[0].field_2) {
        operator_delete(local_428[0]._M_dataplus._M_p,local_428[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    else {
      sprintf((char *)local_428,"%d",(ulong)(uint)local_4a8.Result);
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 1,(char *)local_428);
    }
    cmExprParserHelper::~cmExprParserHelper(&local_4a8);
  }
  else {
    local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_428,"EXPR called with incorrect arguments.","");
    cmCommand::SetError(&this->super_cmCommand,local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428[0]._M_dataplus._M_p != &local_428[0].field_2) {
      operator_delete(local_428[0]._M_dataplus._M_p,local_428[0].field_2._M_allocated_capacity + 1);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool cmMathCommand::HandleExprCommand(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError("EXPR called with incorrect arguments.");
    return false;
  }

  const std::string& outputVariable = args[1];
  const std::string& expression = args[2];

  cmExprParserHelper helper;
  if (!helper.ParseString(expression.c_str(), 0)) {
    std::string e = "cannot parse the expression: \"" + expression + "\": ";
    e += helper.GetError();
    this->SetError(e);
    return false;
  }

  char buffer[1024];
  sprintf(buffer, "%d", helper.GetResult());

  this->Makefile->AddDefinition(outputVariable, buffer);
  return true;
}